

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.h
# Opt level: O0

void SerializeMany<ParamsStream<VectorWriter&,TransactionSerParams>,int,uint256,uint256,unsigned_int,unsigned_int,unsigned_int>
               (ParamsStream<VectorWriter_&,_TransactionSerParams> *s,int *args,uint256 *args_1,
               uint256 *args_2,uint *args_3,uint *args_4,uint *args_5)

{
  long lVar1;
  ParamsStream<VectorWriter_&,_TransactionSerParams> *in_R9;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  Serialize<ParamsStream<VectorWriter&,TransactionSerParams>>(in_R9,0);
  Serialize<ParamsStream<VectorWriter_&,_TransactionSerParams>,_uint256>(in_R9,(uint256 *)0x325ee8);
  Serialize<ParamsStream<VectorWriter_&,_TransactionSerParams>,_uint256>(in_R9,(uint256 *)0x325ef7);
  Serialize<ParamsStream<VectorWriter&,TransactionSerParams>>(in_R9,0);
  Serialize<ParamsStream<VectorWriter&,TransactionSerParams>>(in_R9,0);
  Serialize<ParamsStream<VectorWriter&,TransactionSerParams>>(in_R9,0);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void SerializeMany(Stream& s, const Args&... args)
{
    (::Serialize(s, args), ...);
}